

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

size_t __thiscall
absl::lts_20250127::container_internal::CommonFields::alloc_size
          (CommonFields *this,size_t slot_size,size_t slot_align)

{
  bool has_infoz;
  size_t capacity;
  size_t sVar1;
  RawHashSetLayout local_40;
  size_t local_20;
  size_t slot_align_local;
  size_t slot_size_local;
  CommonFields *this_local;
  
  local_20 = slot_align;
  slot_align_local = slot_size;
  slot_size_local = (size_t)this;
  capacity = CommonFields::capacity(this);
  sVar1 = local_20;
  has_infoz = CommonFields::has_infoz(this);
  RawHashSetLayout::RawHashSetLayout(&local_40,capacity,sVar1,has_infoz);
  sVar1 = RawHashSetLayout::alloc_size(&local_40,slot_align_local);
  return sVar1;
}

Assistant:

size_t alloc_size(size_t slot_size, size_t slot_align) const {
    return RawHashSetLayout(capacity(), slot_align, has_infoz())
        .alloc_size(slot_size);
  }